

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O2

bool __thiscall cfd::core::Script::IsP2wshScript(Script *this)

{
  pointer pSVar1;
  size_t sVar2;
  bool bVar3;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  
  sVar2 = ByteData::GetDataSize(&this->script_data_);
  if ((((sVar2 == 0x22) &&
       (pSVar1 = (this->script_stack_).
                 super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       (long)(this->script_stack_).
             super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 == 0xc0)) &&
      ((pSVar1->op_code_).data_type_ == ScriptOperator::OP_0._8_4_)) &&
     (pSVar1[1].type_ == kElementBinary)) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_20,
               &pSVar1[1].binary_data_.data_);
    sVar2 = ByteData::GetDataSize((ByteData *)&local_20);
    bVar3 = sVar2 == 0x20;
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_20);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Script::IsP2wshScript() const {
  return (
      script_data_.GetDataSize() == kScriptHashP2wshLength &&
      script_stack_.size() == 2 &&
      script_stack_[0].GetOpCode() == ScriptOperator::OP_0 &&
      script_stack_[1].IsBinary() &&
      script_stack_[1].GetBinaryData().GetDataSize() == kByteData256Length);
}